

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Str_Ntk_t * Str_ManNormalize(Gia_Man_t *p)

{
  int nObjs;
  Gia_Man_t *p_00;
  Vec_Wec_t *vGroups_00;
  Vec_Int_t *vRoots_00;
  Str_Ntk_t *pSVar1;
  Vec_Int_t *vRoots;
  Vec_Wec_t *vGroups;
  Gia_Man_t *pMuxes;
  Str_Ntk_t *pNtk;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDupMuxes(p,5);
  vGroups_00 = Str_ManDeriveTrees(p_00);
  Str_ManCheckOverlap(p_00,vGroups_00);
  nObjs = Gia_ManObjNum(p_00);
  vRoots_00 = Str_ManCreateRoots(vGroups_00,nObjs);
  pSVar1 = Str_ManNormalizeInt(p_00,vGroups_00,vRoots_00);
  Gia_ManCleanMark0(p_00);
  Gia_ManStop(p_00);
  Vec_IntFree(vRoots_00);
  Vec_WecFree(vGroups_00);
  return pSVar1;
}

Assistant:

Str_Ntk_t * Str_ManNormalize( Gia_Man_t * p )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pMuxes = Gia_ManDupMuxes( p, 5 );
    Vec_Wec_t * vGroups = Str_ManDeriveTrees( pMuxes );
    Vec_Int_t * vRoots;
    Str_ManCheckOverlap( pMuxes, vGroups );
    vRoots = Str_ManCreateRoots( vGroups, Gia_ManObjNum(pMuxes) );
    pNtk = Str_ManNormalizeInt( pMuxes, vGroups, vRoots );
    Gia_ManCleanMark0( pMuxes );
    Gia_ManStop( pMuxes );
    Vec_IntFree( vRoots );
    Vec_WecFree( vGroups );
    return pNtk;
}